

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MiscSystemFuncs.cpp
# Opt level: O2

void __thiscall
slang::ast::builtins::ValuePlusArgsFunction::~ValuePlusArgsFunction(ValuePlusArgsFunction *this)

{
  SystemSubroutine::~SystemSubroutine(&this->super_SystemSubroutine);
  operator_delete(this,0x38);
  return;
}

Assistant:

ValuePlusArgsFunction() :
        SystemSubroutine(KnownSystemName::ValuePlusArgs, SubroutineKind::Function) {
        hasOutputArgs = true;
    }